

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

path * __thiscall
ArgsManager::GetPathArg
          (path *__return_storage_ptr__,ArgsManager *this,string arg,path *default_value)

{
  bool bVar1;
  char cVar2;
  path *in_RCX;
  long in_FS_OFFSET;
  path result;
  string path_str;
  path pStack_e8;
  path local_c0;
  path local_98;
  path local_70;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsArgNegated(this,(string *)default_value);
  if (bVar1) {
    (__return_storage_ptr__->super_path)._M_pathname.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_path)._M_pathname.field_2 + 8) = 0;
    (__return_storage_ptr__->super_path)._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (_Impl *)0x0;
    (__return_storage_ptr__->super_path)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (__return_storage_ptr__->super_path)._M_pathname._M_string_length = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00113dc4:
      __stack_chk_fail();
    }
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_c0);
    GetArg(&local_48,this,(string *)default_value,&local_70._M_pathname);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_48._M_string_length == 0) {
      std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,in_RCX);
    }
    else {
      fs::PathFromString((path *)&local_c0,&local_48);
      std::filesystem::__cxx11::path::lexically_normal();
      std::filesystem::__cxx11::path::path(&local_70,&local_98);
      std::filesystem::__cxx11::path::~path(&local_98);
      std::filesystem::__cxx11::path::~path(&local_c0);
      cVar2 = std::filesystem::__cxx11::path::has_filename();
      if (cVar2 == '\0') {
        std::filesystem::__cxx11::path::parent_path();
      }
      else {
        std::filesystem::__cxx11::path::path(&pStack_e8,&local_70);
      }
      std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&pStack_e8);
      std::filesystem::__cxx11::path::~path(&pStack_e8);
      std::filesystem::__cxx11::path::~path(&local_70);
    }
    std::__cxx11::string::~string((string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00113dc4;
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path ArgsManager::GetPathArg(std::string arg, const fs::path& default_value) const
{
    if (IsArgNegated(arg)) return fs::path{};
    std::string path_str = GetArg(arg, "");
    if (path_str.empty()) return default_value;
    fs::path result = fs::PathFromString(path_str).lexically_normal();
    // Remove trailing slash, if present.
    return result.has_filename() ? result : result.parent_path();
}